

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

bool DoCheckSpecies(AActor *mo,FName *filterSpecies,bool exclude)

{
  bool bVar1;
  bool local_31;
  undefined1 local_28 [8];
  FName actorSpecies;
  bool exclude_local;
  FName *filterSpecies_local;
  AActor *mo_local;
  
  local_28[7] = exclude;
  _actorSpecies = (PClass *)filterSpecies;
  AActor::GetSpecies((AActor *)local_28);
  bVar1 = FName::operator==(filterSpecies,NAME_None);
  if (bVar1) {
    mo_local._7_1_ = true;
  }
  else {
    if ((local_28[7] & 1) == 0) {
      local_31 = FName::operator==((FName *)local_28,filterSpecies);
    }
    else {
      local_31 = FName::operator!=((FName *)local_28,filterSpecies);
    }
    mo_local._7_1_ = local_31;
  }
  return mo_local._7_1_;
}

Assistant:

static bool DoCheckSpecies(AActor *mo, FName filterSpecies, bool exclude)
{
	FName actorSpecies = mo->GetSpecies();
	if (filterSpecies == NAME_None) return true;
	return exclude ? (actorSpecies != filterSpecies) : (actorSpecies == filterSpecies);
}